

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Keno_HotAndCold.cpp
# Opt level: O3

void __thiscall
Keno_HotAndCold::infoHotAndCold
          (Keno_HotAndCold *this,vector<int,_std::allocator<int>_> *generate20Numbers)

{
  pointer piVar1;
  pointer piVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  pair<int,_int> local_28;
  
  piVar1 = (generate20Numbers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((generate20Numbers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    lVar5 = 0;
    uVar4 = 0;
    piVar2 = saveGeneratedNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    do {
      if (saveGeneratedNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish == piVar2) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&saveGeneratedNumbers,
                   (iterator)
                   saveGeneratedNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)((long)piVar1 + lVar5));
        piVar1 = (generate20Numbers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar2 = saveGeneratedNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      }
      else {
        *saveGeneratedNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish = *(int *)((long)piVar1 + lVar5);
        saveGeneratedNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             saveGeneratedNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 4;
    } while (uVar4 < (ulong)((long)(generate20Numbers->super__Vector_base<int,_std::allocator<int>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)piVar1 >> 2))
    ;
  }
  if ((long)saveGeneratedNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)saveGeneratedNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    uVar4 = (long)saveGeneratedNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)saveGeneratedNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    uVar6 = 0;
    do {
      if (1 < uVar4) {
        uVar3 = 1;
        do {
          if (saveGeneratedNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar6] ==
              saveGeneratedNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar3]) {
            count = count + 1;
          }
          uVar3 = uVar3 + 1;
        } while (uVar4 != uVar3);
      }
      local_28.second = count;
      local_28.first =
           saveGeneratedNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar6];
      std::
      _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
      ::_M_emplace_equal<std::pair<int,int>>
                ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                  *)&hot,&local_28);
      count = 0;
      uVar6 = uVar6 + 1;
      uVar4 = (long)saveGeneratedNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)saveGeneratedNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
    } while (uVar6 < uVar4);
  }
  return;
}

Assistant:

void Keno_HotAndCold::infoHotAndCold(std::vector<int> &generate20Numbers) {
	int currNumber = 0;
	
	for (int i = 0; i < generate20Numbers.size(); ++i) {
		saveGeneratedNumbers.push_back(generate20Numbers[i]);
	}

	for (int i = 0; i < saveGeneratedNumbers.size(); ++i) {
		currNumber = saveGeneratedNumbers[i];
		for (int j = 1; j < saveGeneratedNumbers.size(); ++j) {
			if (saveGeneratedNumbers[i] == saveGeneratedNumbers[j]) {
				count++;
			}
		}
		hot.insert(std::pair<int, int>(currNumber, count));
		count = 0;
	}

	
	/*for (auto it = hot1.begin(); it != hot1.end(); ++it) {
		std::cout << it->first << " " << it->second << std::endl;
	}*/

	//int countHot = 0;
	//int number = 0;;
	//std::cout << "Hot Numbers: ";
	//for (auto it = hot.begin(); it != hot.end(); ++it) {
	//	
	//	for (auto it1 = it++; it1 != hot.end(); ++it1) {
	//		if (it->second < it1->second && it->first<=it1->first) { // count
	//			number = it1->first;
	//		}
	//		else {
	//			number = it -> first;
	//		}
	//	}
	//	printGeneratedNumbers.push_back(number);
	//}

	//int counter1 = 0;
	//for (size_t i = printGeneratedNumbers.size(); i >= 5 ; --i) {
	//	if (counter1 == 5) {
	//		break;
	//	}
	//	std::cout << printGeneratedNumbers[i] << " ";
	//}
	//count++;
	//std::cout << std::endl;
}